

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

shared_ptr<mnf::Manifold> __thiscall RobotManifold::getNewCopy_(RobotManifold *this)

{
  CartesianProduct *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CartesianProduct *in_RSI;
  shared_ptr<mnf::Manifold> sVar1;
  shared_ptr<RobotManifold> copy;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = (CartesianProduct *)operator_new(0xa0);
  mnf::CartesianProduct::CartesianProduct(this_00,in_RSI);
  *(undefined ***)this_00 = &PTR__CartesianProduct_0010e9d8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<RobotManifold*>
            (&local_20,(RobotManifold *)this_00);
  *(CartesianProduct **)this = this_00;
  *(undefined8 *)&this->field_0x8 = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x8 = local_20._M_pi;
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mnf::Manifold>)
         sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<mnf::Manifold> getNewCopy_() const
  {
    std::shared_ptr<RobotManifold> copy(new RobotManifold(*this));
    return copy;
  }